

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  stbi__uint16 sVar1;
  stbi__uint16 *local_48;
  stbi__uint16 *dest;
  stbi__uint16 *src;
  stbi__uint16 *good;
  int j;
  int i;
  uint y_local;
  uint x_local;
  int req_comp_local;
  int img_n_local;
  stbi__uint16 *data_local;
  
  data_local = data;
  if (req_comp != img_n) {
    if (req_comp < 1 || 4 < req_comp) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Yousazoe[P]RayTracing-Dev/vendor/stb/stb_image.h"
                    ,0x706,
                    "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                   );
    }
    data_local = (stbi__uint16 *)stbi__malloc((ulong)(req_comp * x * y * 2));
    if (data_local == (stbi__uint16 *)0x0) {
      free(data);
      stbi__err("outofmem");
      data_local = (stbi__uint16 *)0x0;
    }
    else {
      for (good._0_4_ = 0; (int)good < (int)y; good._0_4_ = (int)good + 1) {
        dest = data + (int)good * x * img_n;
        local_48 = data_local + (int)good * x * req_comp;
        switch(req_comp + -10 + img_n * 8) {
        case 0:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            *local_48 = *dest;
            local_48[1] = 0xffff;
            dest = dest + 1;
            local_48 = local_48 + 2;
          }
          break;
        case 1:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            sVar1 = *dest;
            local_48[2] = sVar1;
            local_48[1] = sVar1;
            *local_48 = sVar1;
            dest = dest + 1;
            local_48 = local_48 + 3;
          }
          break;
        case 2:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            sVar1 = *dest;
            local_48[2] = sVar1;
            local_48[1] = sVar1;
            *local_48 = sVar1;
            local_48[3] = 0xffff;
            dest = dest + 1;
            local_48 = local_48 + 4;
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Yousazoe[P]RayTracing-Dev/vendor/stb/stb_image.h"
                        ,0x723,
                        "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                       );
        case 7:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            *local_48 = *dest;
            dest = dest + 2;
            local_48 = local_48 + 1;
          }
          break;
        case 9:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            sVar1 = *dest;
            local_48[2] = sVar1;
            local_48[1] = sVar1;
            *local_48 = sVar1;
            dest = dest + 2;
            local_48 = local_48 + 3;
          }
          break;
        case 10:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            sVar1 = *dest;
            local_48[2] = sVar1;
            local_48[1] = sVar1;
            *local_48 = sVar1;
            local_48[3] = dest[1];
            dest = dest + 2;
            local_48 = local_48 + 4;
          }
          break;
        case 0xf:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            sVar1 = stbi__compute_y_16((uint)*dest,(uint)dest[1],(uint)dest[2]);
            *local_48 = sVar1;
            dest = dest + 3;
            local_48 = local_48 + 1;
          }
          break;
        case 0x10:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            sVar1 = stbi__compute_y_16((uint)*dest,(uint)dest[1],(uint)dest[2]);
            *local_48 = sVar1;
            local_48[1] = 0xffff;
            dest = dest + 3;
            local_48 = local_48 + 2;
          }
          break;
        case 0x12:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            *local_48 = *dest;
            local_48[1] = dest[1];
            local_48[2] = dest[2];
            local_48[3] = 0xffff;
            dest = dest + 3;
            local_48 = local_48 + 4;
          }
          break;
        case 0x17:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            sVar1 = stbi__compute_y_16((uint)*dest,(uint)dest[1],(uint)dest[2]);
            *local_48 = sVar1;
            dest = dest + 4;
            local_48 = local_48 + 1;
          }
          break;
        case 0x18:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            sVar1 = stbi__compute_y_16((uint)*dest,(uint)dest[1],(uint)dest[2]);
            *local_48 = sVar1;
            local_48[1] = dest[3];
            dest = dest + 4;
            local_48 = local_48 + 2;
          }
          break;
        case 0x19:
          for (good._4_4_ = x - 1; -1 < good._4_4_; good._4_4_ = good._4_4_ + -1) {
            *local_48 = *dest;
            local_48[1] = dest[1];
            local_48[2] = dest[2];
            dest = dest + 4;
            local_48 = local_48 + 3;
          }
        }
      }
      free(data);
    }
  }
  return data_local;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return (stbi__uint16*) stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}